

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_doubleFast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  U32 UVar1;
  U32 UVar2;
  U32 UVar3;
  U32 UVar4;
  U32 *pUVar5;
  U32 *pUVar6;
  BYTE *pBVar7;
  ZSTD_matchState_t *pZVar8;
  U32 *pUVar9;
  U32 *pUVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  U32 UVar21;
  U32 UVar22;
  U32 UVar23;
  BYTE *pBVar24;
  BYTE *pBVar25;
  BYTE *pBVar26;
  BYTE *pBVar27;
  size_t sVar28;
  size_t sVar29;
  size_t sVar30;
  size_t sVar31;
  long lVar32;
  U64 UVar33;
  U64 UVar34;
  BYTE *pBVar35;
  ulong uVar36;
  bool bVar37;
  uint local_17e8;
  U32 local_17e4;
  BYTE *local_1790;
  BYTE *local_1780;
  BYTE *local_16e0;
  BYTE *local_16d0;
  uint local_167c;
  uint local_1678;
  U32 local_1674;
  BYTE *local_1620;
  BYTE *local_1610;
  BYTE *local_1570;
  BYTE *local_1560;
  uint local_150c;
  uint local_1508;
  U32 local_1504;
  BYTE *local_14b0;
  BYTE *local_14a0;
  BYTE *local_1400;
  BYTE *local_13f0;
  uint local_139c;
  uint local_1398;
  U32 local_1394;
  BYTE *local_1340;
  BYTE *local_1330;
  BYTE *local_1290;
  BYTE *local_1280;
  uint local_122c;
  U32 mls;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  U32 tmpOff_3;
  size_t rLength_3;
  U32 tmpOffset_3;
  size_t repLength2_3;
  BYTE *repEnd2_3;
  BYTE *repMatch2_3;
  U32 repIndex2_3;
  U32 current2_3;
  U32 indexToInsert_3;
  BYTE *dictMatchL3_3;
  BYTE *pBStack_1198;
  U32 dictMatchIndexL3_3;
  BYTE *matchL3_3;
  U32 matchIndexL3_3;
  size_t dictHLNext_3;
  size_t hl3_3;
  BYTE *pBStack_1170;
  U32 dictMatchIndexS_3;
  BYTE *dictMatchL_3;
  U32 dictMatchIndexL_3;
  BYTE *repMatchEnd_3;
  BYTE *repMatch_3;
  BYTE *pBStack_1148;
  U32 repIndex_3;
  BYTE *match_3;
  BYTE *matchLong_3;
  U32 matchIndexS_3;
  U32 matchIndexL_3;
  U32 current_3;
  size_t dictHS_3;
  size_t dictHL_3;
  size_t h_3;
  size_t h2_3;
  long lStack_1100;
  U32 offset_5;
  size_t mLength_3;
  U32 maxRep_3;
  U32 dictAndPrefixLength_3;
  U32 dictHBitsS_3;
  U32 dictHBitsL_3;
  U32 dictIndexDelta_3;
  BYTE *dictEnd_3;
  BYTE *dictStart_3;
  BYTE *dictBase_3;
  U32 dictStartIndex_3;
  U32 *dictHashSmall_3;
  U32 *dictHashLong_3;
  ZSTD_compressionParameters *dictCParams_3;
  ZSTD_matchState_t *dms_3;
  uint local_1098;
  U32 offsetSaved_3;
  U32 offset_2_3;
  U32 offset_1_3;
  BYTE *ilimit_3;
  BYTE *iend_3;
  BYTE *prefixLowest_3;
  U32 prefixLowestIndex_3;
  U32 maxDistance_3;
  U32 lowestValid_3;
  U32 endIndex_3;
  BYTE *anchor_3;
  BYTE *ip_18;
  BYTE *istart_3;
  BYTE *base_3;
  U32 hBitsS_3;
  U32 *hashSmall_3;
  U32 hBitsL_3;
  U32 *hashLong_3;
  ZSTD_compressionParameters *cParams_3;
  U32 tmpOff_2;
  size_t rLength_2;
  U32 tmpOffset_2;
  size_t repLength2_2;
  BYTE *repEnd2_2;
  BYTE *repMatch2_2;
  U32 repIndex2_2;
  U32 current2_2;
  U32 indexToInsert_2;
  BYTE *dictMatchL3_2;
  BYTE *pBStack_fa0;
  U32 dictMatchIndexL3_2;
  BYTE *matchL3_2;
  U32 matchIndexL3_2;
  size_t dictHLNext_2;
  size_t hl3_2;
  BYTE *pBStack_f78;
  U32 dictMatchIndexS_2;
  BYTE *dictMatchL_2;
  U32 dictMatchIndexL_2;
  BYTE *repMatchEnd_2;
  BYTE *repMatch_2;
  BYTE *pBStack_f50;
  U32 repIndex_2;
  BYTE *match_2;
  BYTE *matchLong_2;
  U32 matchIndexS_2;
  U32 matchIndexL_2;
  U32 current_2;
  size_t dictHS_2;
  size_t dictHL_2;
  size_t h_2;
  size_t h2_2;
  long lStack_f08;
  U32 offset_4;
  size_t mLength_2;
  U32 maxRep_2;
  U32 dictAndPrefixLength_2;
  U32 dictHBitsS_2;
  U32 dictHBitsL_2;
  U32 dictIndexDelta_2;
  BYTE *dictEnd_2;
  BYTE *dictStart_2;
  BYTE *dictBase_2;
  U32 dictStartIndex_2;
  U32 *dictHashSmall_2;
  U32 *dictHashLong_2;
  ZSTD_compressionParameters *dictCParams_2;
  ZSTD_matchState_t *dms_2;
  uint local_ea0;
  U32 offsetSaved_2;
  U32 offset_2_2;
  U32 offset_1_2;
  BYTE *ilimit_2;
  BYTE *iend_2;
  BYTE *prefixLowest_2;
  U32 prefixLowestIndex_2;
  U32 maxDistance_2;
  U32 lowestValid_2;
  U32 endIndex_2;
  BYTE *anchor_2;
  BYTE *ip_12;
  BYTE *istart_2;
  BYTE *base_2;
  U32 hBitsS_2;
  U32 *hashSmall_2;
  U32 hBitsL_2;
  U32 *hashLong_2;
  ZSTD_compressionParameters *cParams_2;
  U32 tmpOff_1;
  size_t rLength_1;
  U32 tmpOffset_1;
  size_t repLength2_1;
  BYTE *repEnd2_1;
  BYTE *repMatch2_1;
  U32 repIndex2_1;
  U32 current2_1;
  U32 indexToInsert_1;
  BYTE *dictMatchL3_1;
  BYTE *pBStack_da8;
  U32 dictMatchIndexL3_1;
  BYTE *matchL3_1;
  U32 matchIndexL3_1;
  size_t dictHLNext_1;
  size_t hl3_1;
  BYTE *pBStack_d80;
  U32 dictMatchIndexS_1;
  BYTE *dictMatchL_1;
  U32 dictMatchIndexL_1;
  BYTE *repMatchEnd_1;
  BYTE *repMatch_1;
  BYTE *pBStack_d58;
  U32 repIndex_1;
  BYTE *match_1;
  BYTE *matchLong_1;
  U32 matchIndexS_1;
  U32 matchIndexL_1;
  U32 current_1;
  size_t dictHS_1;
  size_t dictHL_1;
  size_t h_1;
  size_t h2_1;
  long lStack_d10;
  U32 offset_3;
  size_t mLength_1;
  U32 maxRep_1;
  U32 dictAndPrefixLength_1;
  U32 dictHBitsS_1;
  U32 dictHBitsL_1;
  U32 dictIndexDelta_1;
  BYTE *dictEnd_1;
  BYTE *dictStart_1;
  BYTE *dictBase_1;
  U32 dictStartIndex_1;
  U32 *dictHashSmall_1;
  U32 *dictHashLong_1;
  ZSTD_compressionParameters *dictCParams_1;
  ZSTD_matchState_t *dms_1;
  uint local_ca8;
  U32 offsetSaved_1;
  U32 offset_2_1;
  U32 offset_1_1;
  BYTE *ilimit_1;
  BYTE *iend_1;
  BYTE *prefixLowest_1;
  U32 prefixLowestIndex_1;
  U32 maxDistance_1;
  U32 lowestValid_1;
  U32 endIndex_1;
  BYTE *anchor_1;
  BYTE *ip_6;
  BYTE *istart_1;
  BYTE *base_1;
  U32 hBitsS_1;
  U32 *hashSmall_1;
  U32 hBitsL_1;
  U32 *hashLong_1;
  ZSTD_compressionParameters *cParams_1;
  U32 tmpOff;
  size_t rLength;
  U32 tmpOffset;
  size_t repLength2;
  BYTE *repEnd2;
  BYTE *repMatch2;
  U32 repIndex2;
  U32 current2;
  U32 indexToInsert;
  BYTE *dictMatchL3;
  BYTE *pBStack_bb0;
  U32 dictMatchIndexL3;
  BYTE *matchL3;
  U32 matchIndexL3;
  size_t dictHLNext;
  size_t hl3;
  BYTE *pBStack_b88;
  U32 dictMatchIndexS;
  BYTE *dictMatchL;
  U32 dictMatchIndexL;
  BYTE *repMatchEnd;
  BYTE *repMatch;
  BYTE *pBStack_b60;
  U32 repIndex;
  BYTE *match;
  BYTE *matchLong;
  U32 matchIndexS;
  U32 matchIndexL;
  U32 current;
  size_t dictHS;
  size_t dictHL;
  size_t h;
  size_t h2;
  long lStack_b18;
  U32 offset;
  size_t mLength;
  U32 maxRep;
  U32 dictAndPrefixLength;
  U32 dictHBitsS;
  U32 dictHBitsL;
  U32 dictIndexDelta;
  BYTE *dictEnd;
  BYTE *dictStart;
  BYTE *dictBase;
  U32 dictStartIndex;
  U32 *dictHashSmall;
  U32 *dictHashLong;
  ZSTD_compressionParameters *dictCParams;
  ZSTD_matchState_t *dms;
  uint local_ab0;
  U32 offsetSaved;
  U32 offset_2;
  U32 offset_1;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *prefixLowest;
  U32 prefixLowestIndex;
  U32 maxDistance;
  U32 lowestValid;
  U32 endIndex;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  BYTE *base;
  U32 hBitsS;
  U32 *hashSmall;
  U32 hBitsL;
  U32 *hashLong;
  ZSTD_compressionParameters *cParams;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  BYTE *litEnd_3;
  BYTE *litLimit_w_3;
  BYTE *litEnd_4;
  BYTE *litLimit_w_4;
  BYTE *litEnd_2;
  BYTE *litLimit_w_2;
  BYTE *litEnd_5;
  BYTE *litLimit_w_5;
  BYTE *litEnd_6;
  BYTE *litLimit_w_6;
  BYTE *litEnd_8;
  BYTE *litLimit_w_8;
  BYTE *litEnd_9;
  BYTE *litLimit_w_9;
  BYTE *litEnd_7;
  BYTE *litLimit_w_7;
  BYTE *litEnd_10;
  BYTE *litLimit_w_10;
  BYTE *litEnd_11;
  BYTE *litLimit_w_11;
  BYTE *litEnd_13;
  BYTE *litLimit_w_13;
  BYTE *litEnd_14;
  BYTE *litLimit_w_14;
  BYTE *litEnd_12;
  BYTE *litLimit_w_12;
  BYTE *litEnd_15;
  BYTE *litLimit_w_15;
  BYTE *litEnd_16;
  BYTE *litLimit_w_16;
  BYTE *litEnd_18;
  BYTE *litLimit_w_18;
  BYTE *litEnd_19;
  BYTE *litLimit_w_19;
  BYTE *litEnd_17;
  BYTE *litLimit_w_17;
  BYTE *oend_17;
  BYTE *op_17;
  BYTE *ip_21;
  ptrdiff_t diff_17;
  BYTE *oend_19;
  BYTE *op_19;
  BYTE *ip_23;
  ptrdiff_t diff_19;
  BYTE *oend_18;
  BYTE *op_18;
  BYTE *ip_22;
  ptrdiff_t diff_18;
  BYTE *oend_16;
  BYTE *op_16;
  BYTE *ip_20;
  ptrdiff_t diff_16;
  BYTE *oend_15;
  BYTE *op_15;
  BYTE *ip_19;
  ptrdiff_t diff_15;
  BYTE *oend_12;
  BYTE *op_12;
  BYTE *ip_15;
  ptrdiff_t diff_12;
  BYTE *oend_14;
  BYTE *op_14;
  BYTE *ip_17;
  ptrdiff_t diff_14;
  BYTE *oend_13;
  BYTE *op_13;
  BYTE *ip_16;
  ptrdiff_t diff_13;
  BYTE *oend_11;
  BYTE *op_11;
  BYTE *ip_14;
  ptrdiff_t diff_11;
  BYTE *oend_10;
  BYTE *op_10;
  BYTE *ip_13;
  ptrdiff_t diff_10;
  BYTE *oend_7;
  BYTE *op_7;
  BYTE *ip_9;
  ptrdiff_t diff_7;
  BYTE *oend_9;
  BYTE *op_9;
  BYTE *ip_11;
  ptrdiff_t diff_9;
  BYTE *oend_8;
  BYTE *op_8;
  BYTE *ip_10;
  ptrdiff_t diff_8;
  BYTE *oend_6;
  BYTE *op_6;
  BYTE *ip_8;
  ptrdiff_t diff_6;
  BYTE *oend_5;
  BYTE *op_5;
  BYTE *ip_7;
  ptrdiff_t diff_5;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_3;
  ptrdiff_t diff_2;
  BYTE *oend_4;
  BYTE *op_4;
  BYTE *ip_5;
  ptrdiff_t diff_4;
  BYTE *oend_3;
  BYTE *op_3;
  BYTE *ip_4;
  ptrdiff_t diff_3;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  
  iVar16 = (int)srcSize;
  iVar14 = (int)src;
  switch((ms->cParams).minMatch) {
  default:
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar6 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar7 = (ms->window).base;
    iVar15 = (int)pBVar7;
    uVar17 = (iVar14 - iVar15) + iVar16;
    UVar21 = (ms->window).dictLimit;
    uVar18 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    local_122c = UVar21;
    if (uVar18 < uVar17 - UVar21) {
      local_122c = uVar17 - uVar18;
    }
    pBVar24 = pBVar7 + local_122c;
    pBVar25 = (BYTE *)((long)src + srcSize);
    pBVar26 = pBVar25 + -8;
    offsetSaved = *rep;
    local_ab0 = rep[1];
    pZVar8 = ms->dictMatchState;
    pUVar9 = pZVar8->hashTable;
    pUVar10 = pZVar8->chainTable;
    pBVar11 = (pZVar8->window).base;
    pBVar27 = pBVar11 + (pZVar8->window).dictLimit;
    pBVar12 = (pZVar8->window).nextSrc;
    uVar19 = local_122c - ((int)pBVar12 - (int)pBVar11);
    UVar3 = (pZVar8->cParams).hashLog;
    UVar4 = (pZVar8->cParams).chainLog;
    uVar20 = (iVar14 - (int)pBVar24) + ((int)pBVar12 - (int)pBVar27);
    if (UVar21 + uVar18 < uVar17) {
      __assert_fail("lowestValid + maxDistance >= endIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3b45,
                    "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                   );
    }
    anchor = (BYTE *)((long)src + (long)(int)(uint)(uVar20 == 0));
    if (uVar20 < offsetSaved) {
      __assert_fail("offset_1 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3b52,
                    "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                   );
    }
    _lowestValid = (BYTE *)src;
    if (uVar20 < local_ab0) {
      __assert_fail("offset_2 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3b53,
                    "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                   );
    }
LAB_001876fd:
    if (anchor < pBVar26) {
      sVar28 = ZSTD_hashPtr(anchor,UVar1,8);
      sVar29 = ZSTD_hashPtr(anchor,UVar2,4);
      sVar30 = ZSTD_hashPtr(anchor,UVar3,8);
      sVar31 = ZSTD_hashPtr(anchor,UVar4,4);
      iVar16 = (int)anchor;
      UVar21 = iVar16 - iVar15;
      uVar17 = pUVar5[sVar28];
      matchLong._4_4_ = pUVar6[sVar29];
      match = pBVar7 + uVar17;
      pBStack_b60 = pBVar7 + matchLong._4_4_;
      uVar18 = (UVar21 + 1) - offsetSaved;
      if (uVar18 < local_122c) {
        local_1280 = pBVar11 + (uVar18 - uVar19);
      }
      else {
        local_1280 = pBVar7 + uVar18;
      }
      pUVar6[sVar29] = UVar21;
      pUVar5[sVar28] = UVar21;
      if ((local_122c - 1) - uVar18 < 3) {
LAB_00188487:
        if (local_122c < uVar17) {
          UVar33 = MEM_read64(match);
          UVar34 = MEM_read64(anchor);
          if (UVar33 != UVar34) goto LAB_0018876c;
          sVar28 = ZSTD_count(anchor + 8,match + 8,pBVar25);
          lStack_b18 = sVar28 + 8;
          h2._4_4_ = iVar16 - (int)match;
          while( true ) {
            bVar37 = false;
            if (_lowestValid < anchor && pBVar24 < match) {
              bVar37 = anchor[-1] == match[-1];
            }
            if (!bVar37) break;
            anchor = anchor + -1;
            match = match + -1;
            lStack_b18 = lStack_b18 + 1;
          }
          goto LAB_00188e06;
        }
        uVar17 = pUVar9[sVar30];
        pBStack_b88 = pBVar11 + uVar17;
        if (pBVar12 <= pBStack_b88) {
          __assert_fail("dictMatchL < dictEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x3b8a,
                        "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                       );
        }
        if (pBVar27 < pBStack_b88) {
          UVar33 = MEM_read64(pBStack_b88);
          UVar34 = MEM_read64(anchor);
          if (UVar33 == UVar34) {
            sVar28 = ZSTD_count_2segments(anchor + 8,pBStack_b88 + 8,pBVar25,pBVar12,pBVar24);
            lStack_b18 = sVar28 + 8;
            h2._4_4_ = (UVar21 - uVar17) - uVar19;
            while( true ) {
              bVar37 = false;
              if (_lowestValid < anchor && pBVar27 < pBStack_b88) {
                bVar37 = anchor[-1] == pBStack_b88[-1];
              }
              if (!bVar37) break;
              anchor = anchor + -1;
              pBStack_b88 = pBStack_b88 + -1;
              lStack_b18 = lStack_b18 + 1;
            }
            goto LAB_00188e06;
          }
        }
LAB_0018876c:
        if (local_122c < matchLong._4_4_) {
          UVar22 = MEM_read32(pBStack_b60);
          UVar23 = MEM_read32(anchor);
          if (UVar22 == UVar23) {
LAB_00188863:
            sVar28 = ZSTD_hashPtr(anchor + 1,UVar1,8);
            sVar29 = ZSTD_hashPtr(anchor + 1,UVar3,8);
            uVar17 = pUVar5[sVar28];
            pBStack_bb0 = pBVar7 + uVar17;
            pUVar5[sVar28] = UVar21 + 1;
            if (local_122c < uVar17) {
              UVar33 = MEM_read64(pBStack_bb0);
              UVar34 = MEM_read64(anchor + 1);
              if (UVar33 != UVar34) goto code_r0x00188c14;
              sVar28 = ZSTD_count(anchor + 9,pBStack_bb0 + 8,pBVar25);
              lStack_b18 = sVar28 + 8;
              anchor = anchor + 1;
              h2._4_4_ = (int)anchor - (int)pBStack_bb0;
              while( true ) {
                bVar37 = false;
                if (_lowestValid < anchor && pBVar24 < pBStack_bb0) {
                  bVar37 = anchor[-1] == pBStack_bb0[-1];
                }
                if (!bVar37) break;
                anchor = anchor + -1;
                pBStack_bb0 = pBStack_bb0 + -1;
                lStack_b18 = lStack_b18 + 1;
              }
            }
            else {
              uVar17 = pUVar9[sVar29];
              _current2 = pBVar11 + uVar17;
              if (pBVar12 <= _current2) {
                __assert_fail("dictMatchL3 < dictEnd",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x3bbd,
                              "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                             );
              }
              if (pBVar27 < _current2) {
                UVar33 = MEM_read64(_current2);
                UVar34 = MEM_read64(anchor + 1);
                if (UVar33 == UVar34) {
                  sVar28 = ZSTD_count_2segments(anchor + 9,_current2 + 8,pBVar25,pBVar12,pBVar24);
                  lStack_b18 = sVar28 + 8;
                  anchor = anchor + 1;
                  h2._4_4_ = ((UVar21 + 1) - uVar17) - uVar19;
                  while( true ) {
                    bVar37 = false;
                    if (_lowestValid < anchor && pBVar27 < _current2) {
                      bVar37 = anchor[-1] == _current2[-1];
                    }
                    if (!bVar37) break;
                    anchor = anchor + -1;
                    _current2 = _current2 + -1;
                    lStack_b18 = lStack_b18 + 1;
                  }
                  goto LAB_00188e06;
                }
              }
code_r0x00188c14:
              if (matchLong._4_4_ < local_122c) {
                sVar28 = ZSTD_count_2segments(anchor + 4,pBStack_b60 + 4,pBVar25,pBVar12,pBVar24);
                lStack_b18 = sVar28 + 4;
                h2._4_4_ = UVar21 - matchLong._4_4_;
                while( true ) {
                  bVar37 = false;
                  if (_lowestValid < anchor && pBVar27 < pBStack_b60) {
                    bVar37 = anchor[-1] == pBStack_b60[-1];
                  }
                  if (!bVar37) break;
                  anchor = anchor + -1;
                  pBStack_b60 = pBStack_b60 + -1;
                  lStack_b18 = lStack_b18 + 1;
                }
              }
              else {
                sVar28 = ZSTD_count(anchor + 4,pBStack_b60 + 4,pBVar25);
                lStack_b18 = sVar28 + 4;
                h2._4_4_ = iVar16 - (int)pBStack_b60;
                while( true ) {
                  bVar37 = false;
                  if (_lowestValid < anchor && pBVar24 < pBStack_b60) {
                    bVar37 = anchor[-1] == pBStack_b60[-1];
                  }
                  if (!bVar37) break;
                  anchor = anchor + -1;
                  pBStack_b60 = pBStack_b60 + -1;
                  lStack_b18 = lStack_b18 + 1;
                }
              }
            }
LAB_00188e06:
            local_ab0 = offsetSaved;
            offsetSaved = h2._4_4_;
            uVar36 = (long)anchor - (long)_lowestValid;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar36) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar25 < _lowestValid + uVar36) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar25 + -0x20 < _lowestValid + uVar36) {
              ZSTD_safecopyLiterals
                        (seqStore->lit,_lowestValid,_lowestValid + uVar36,pBVar25 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,_lowestValid);
              if (0x10 < uVar36) {
                pBVar13 = seqStore->lit;
                pBVar35 = pBVar13 + 0x10;
                lVar32 = (long)pBVar35 - (long)(_lowestValid + 0x10);
                if (lVar32 < 8 && -0x10 < lVar32) {
                  __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1268,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                if (lVar32 < 0x10 && -0x10 < lVar32) {
                  __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1270,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                ZSTD_copy16(pBVar35,_lowestValid + 0x10);
                while (pBVar13 = pBVar13 + 0x20, pBVar13 < pBVar35 + (uVar36 - 0x10)) {
                  op_2 = _lowestValid + 0x20;
                  ZSTD_copy16(pBVar13,op_2);
                  ZSTD_copy16(pBVar13 + 0x10,_lowestValid + 0x30);
                  _lowestValid = op_2;
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar36;
            if (0xffff < uVar36) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x204d,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->litLength = (U16)uVar36;
            seqStore->sequences->offset = h2._4_4_ + 3;
            if (0xffff < lStack_b18 - 3U) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(lStack_b18 - 3U);
            seqStore->sequences = seqStore->sequences + 1;
            goto LAB_001893d7;
          }
        }
        else {
          pBStack_b60 = pBVar11 + pUVar10[sVar31];
          matchLong._4_4_ = pUVar10[sVar31] + uVar19;
          if (pBVar27 < pBStack_b60) {
            UVar22 = MEM_read32(pBStack_b60);
            UVar23 = MEM_read32(anchor);
            if (UVar22 == UVar23) goto LAB_00188863;
          }
        }
        anchor = anchor + ((long)anchor - (long)_lowestValid >> 8) + 1;
      }
      else {
        UVar22 = MEM_read32(local_1280);
        UVar23 = MEM_read32(anchor + 1);
        if (UVar22 != UVar23) goto LAB_00188487;
        local_1290 = pBVar25;
        if (uVar18 < local_122c) {
          local_1290 = pBVar12;
        }
        sVar28 = ZSTD_count_2segments(anchor + 5,local_1280 + 4,pBVar25,local_1290,pBVar24);
        lStack_b18 = sVar28 + 4;
        anchor = anchor + 1;
        uVar36 = (long)anchor - (long)_lowestValid;
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar36) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar25 < _lowestValid + uVar36) {
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar25 + -0x20 < _lowestValid + uVar36) {
          ZSTD_safecopyLiterals(seqStore->lit,_lowestValid,_lowestValid + uVar36,pBVar25 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,_lowestValid);
          if (0x10 < uVar36) {
            pBVar13 = seqStore->lit;
            pBVar35 = pBVar13 + 0x10;
            lVar32 = (long)pBVar35 - (long)(_lowestValid + 0x10);
            if (lVar32 < 8 && -0x10 < lVar32) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if (lVar32 < 0x10 && -0x10 < lVar32) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            ZSTD_copy16(pBVar35,_lowestValid + 0x10);
            while (pBVar13 = pBVar13 + 0x20, pBVar13 < pBVar35 + (uVar36 - 0x10)) {
              op = _lowestValid + 0x20;
              ZSTD_copy16(pBVar13,op);
              ZSTD_copy16(pBVar13 + 0x10,_lowestValid + 0x30);
              _lowestValid = op;
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar36;
        if (0xffff < uVar36) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar36;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar28 + 1) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar28 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_001893d7:
        _lowestValid = anchor + lStack_b18;
        anchor = _lowestValid;
        if (_lowestValid <= pBVar26) {
          uVar17 = UVar21 + 2;
          sVar28 = ZSTD_hashPtr(pBVar7 + uVar17,UVar1,8);
          pUVar5[sVar28] = uVar17;
          sVar28 = ZSTD_hashPtr(_lowestValid + -2,UVar1,8);
          pUVar5[sVar28] = ((int)_lowestValid + -2) - iVar15;
          sVar28 = ZSTD_hashPtr(pBVar7 + uVar17,UVar2,4);
          pUVar6[sVar28] = uVar17;
          sVar28 = ZSTD_hashPtr(_lowestValid + -1,UVar2,4);
          pUVar6[sVar28] = ((int)_lowestValid + -1) - iVar15;
          for (; uVar17 = local_ab0, _lowestValid = anchor, anchor <= pBVar26;
              anchor = anchor + sVar28 + 4) {
            UVar21 = (int)anchor - iVar15;
            uVar18 = UVar21 - local_ab0;
            if (uVar18 < local_122c) {
              local_1330 = pBVar11 + ((ulong)uVar18 - (ulong)uVar19);
            }
            else {
              local_1330 = pBVar7 + uVar18;
            }
            if ((local_122c - 1) - uVar18 < 3) break;
            UVar22 = MEM_read32(local_1330);
            UVar23 = MEM_read32(anchor);
            if (UVar22 != UVar23) break;
            local_1340 = pBVar25;
            if (uVar18 < local_122c) {
              local_1340 = pBVar12;
            }
            sVar28 = ZSTD_count_2segments(anchor + 4,local_1330 + 4,pBVar25,local_1340,pBVar24);
            local_ab0 = offsetSaved;
            offsetSaved = uVar17;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar25 < anchor) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar25 + -0x20 < anchor) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor,anchor,pBVar25 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar28 + 1) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(sVar28 + 1);
            seqStore->sequences = seqStore->sequences + 1;
            sVar29 = ZSTD_hashPtr(anchor,UVar2,4);
            pUVar6[sVar29] = UVar21;
            sVar29 = ZSTD_hashPtr(anchor,UVar1,8);
            pUVar5[sVar29] = UVar21;
          }
        }
      }
      goto LAB_001876fd;
    }
    if (offsetSaved == 0) {
      local_1394 = 0;
    }
    else {
      local_1394 = offsetSaved;
    }
    *rep = local_1394;
    if (local_ab0 == 0) {
      local_1398 = 0;
    }
    else {
      local_1398 = local_ab0;
    }
    rep[1] = local_1398;
    ms_local = (ZSTD_matchState_t *)(pBVar25 + -(long)_lowestValid);
    break;
  case 5:
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar6 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar7 = (ms->window).base;
    iVar15 = (int)pBVar7;
    uVar17 = (iVar14 - iVar15) + iVar16;
    UVar21 = (ms->window).dictLimit;
    uVar18 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    local_139c = UVar21;
    if (uVar18 < uVar17 - UVar21) {
      local_139c = uVar17 - uVar18;
    }
    pBVar24 = pBVar7 + local_139c;
    pBVar25 = (BYTE *)((long)src + srcSize);
    pBVar26 = pBVar25 + -8;
    offsetSaved_1 = *rep;
    local_ca8 = rep[1];
    pZVar8 = ms->dictMatchState;
    pUVar9 = pZVar8->hashTable;
    pUVar10 = pZVar8->chainTable;
    pBVar11 = (pZVar8->window).base;
    pBVar27 = pBVar11 + (pZVar8->window).dictLimit;
    pBVar12 = (pZVar8->window).nextSrc;
    uVar19 = local_139c - ((int)pBVar12 - (int)pBVar11);
    UVar3 = (pZVar8->cParams).hashLog;
    UVar4 = (pZVar8->cParams).chainLog;
    uVar20 = (iVar14 - (int)pBVar24) + ((int)pBVar12 - (int)pBVar27);
    if (UVar21 + uVar18 < uVar17) {
      __assert_fail("lowestValid + maxDistance >= endIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3b45,
                    "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                   );
    }
    anchor_1 = (BYTE *)((long)src + (long)(int)(uint)(uVar20 == 0));
    if (uVar20 < offsetSaved_1) {
      __assert_fail("offset_1 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3b52,
                    "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                   );
    }
    _lowestValid_1 = (BYTE *)src;
    if (uVar20 < local_ca8) {
      __assert_fail("offset_2 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3b53,
                    "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                   );
    }
LAB_0018ab09:
    if (anchor_1 < pBVar26) {
      sVar28 = ZSTD_hashPtr(anchor_1,UVar1,8);
      sVar29 = ZSTD_hashPtr(anchor_1,UVar2,5);
      sVar30 = ZSTD_hashPtr(anchor_1,UVar3,8);
      sVar31 = ZSTD_hashPtr(anchor_1,UVar4,5);
      iVar16 = (int)anchor_1;
      UVar21 = iVar16 - iVar15;
      uVar17 = pUVar5[sVar28];
      matchLong_1._4_4_ = pUVar6[sVar29];
      match_1 = pBVar7 + uVar17;
      pBStack_d58 = pBVar7 + matchLong_1._4_4_;
      uVar18 = (UVar21 + 1) - offsetSaved_1;
      if (uVar18 < local_139c) {
        local_13f0 = pBVar11 + (uVar18 - uVar19);
      }
      else {
        local_13f0 = pBVar7 + uVar18;
      }
      pUVar6[sVar29] = UVar21;
      pUVar5[sVar28] = UVar21;
      if ((local_139c - 1) - uVar18 < 3) {
LAB_0018b9cb:
        if (local_139c < uVar17) {
          UVar33 = MEM_read64(match_1);
          UVar34 = MEM_read64(anchor_1);
          if (UVar33 != UVar34) goto LAB_0018bcb0;
          sVar28 = ZSTD_count(anchor_1 + 8,match_1 + 8,pBVar25);
          lStack_d10 = sVar28 + 8;
          h2_1._4_4_ = iVar16 - (int)match_1;
          while( true ) {
            bVar37 = false;
            if (_lowestValid_1 < anchor_1 && pBVar24 < match_1) {
              bVar37 = anchor_1[-1] == match_1[-1];
            }
            if (!bVar37) break;
            anchor_1 = anchor_1 + -1;
            match_1 = match_1 + -1;
            lStack_d10 = lStack_d10 + 1;
          }
          goto LAB_0018c34a;
        }
        uVar17 = pUVar9[sVar30];
        pBStack_d80 = pBVar11 + uVar17;
        if (pBVar12 <= pBStack_d80) {
          __assert_fail("dictMatchL < dictEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x3b8a,
                        "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                       );
        }
        if (pBVar27 < pBStack_d80) {
          UVar33 = MEM_read64(pBStack_d80);
          UVar34 = MEM_read64(anchor_1);
          if (UVar33 == UVar34) {
            sVar28 = ZSTD_count_2segments(anchor_1 + 8,pBStack_d80 + 8,pBVar25,pBVar12,pBVar24);
            lStack_d10 = sVar28 + 8;
            h2_1._4_4_ = (UVar21 - uVar17) - uVar19;
            while( true ) {
              bVar37 = false;
              if (_lowestValid_1 < anchor_1 && pBVar27 < pBStack_d80) {
                bVar37 = anchor_1[-1] == pBStack_d80[-1];
              }
              if (!bVar37) break;
              anchor_1 = anchor_1 + -1;
              pBStack_d80 = pBStack_d80 + -1;
              lStack_d10 = lStack_d10 + 1;
            }
            goto LAB_0018c34a;
          }
        }
LAB_0018bcb0:
        if (local_139c < matchLong_1._4_4_) {
          UVar22 = MEM_read32(pBStack_d58);
          UVar23 = MEM_read32(anchor_1);
          if (UVar22 == UVar23) {
LAB_0018bda7:
            sVar28 = ZSTD_hashPtr(anchor_1 + 1,UVar1,8);
            sVar29 = ZSTD_hashPtr(anchor_1 + 1,UVar3,8);
            uVar17 = pUVar5[sVar28];
            pBStack_da8 = pBVar7 + uVar17;
            pUVar5[sVar28] = UVar21 + 1;
            if (local_139c < uVar17) {
              UVar33 = MEM_read64(pBStack_da8);
              UVar34 = MEM_read64(anchor_1 + 1);
              if (UVar33 != UVar34) goto code_r0x0018c158;
              sVar28 = ZSTD_count(anchor_1 + 9,pBStack_da8 + 8,pBVar25);
              lStack_d10 = sVar28 + 8;
              anchor_1 = anchor_1 + 1;
              h2_1._4_4_ = (int)anchor_1 - (int)pBStack_da8;
              while( true ) {
                bVar37 = false;
                if (_lowestValid_1 < anchor_1 && pBVar24 < pBStack_da8) {
                  bVar37 = anchor_1[-1] == pBStack_da8[-1];
                }
                if (!bVar37) break;
                anchor_1 = anchor_1 + -1;
                pBStack_da8 = pBStack_da8 + -1;
                lStack_d10 = lStack_d10 + 1;
              }
            }
            else {
              uVar17 = pUVar9[sVar29];
              _current2_1 = pBVar11 + uVar17;
              if (pBVar12 <= _current2_1) {
                __assert_fail("dictMatchL3 < dictEnd",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x3bbd,
                              "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                             );
              }
              if (pBVar27 < _current2_1) {
                UVar33 = MEM_read64(_current2_1);
                UVar34 = MEM_read64(anchor_1 + 1);
                if (UVar33 == UVar34) {
                  sVar28 = ZSTD_count_2segments
                                     (anchor_1 + 9,_current2_1 + 8,pBVar25,pBVar12,pBVar24);
                  lStack_d10 = sVar28 + 8;
                  anchor_1 = anchor_1 + 1;
                  h2_1._4_4_ = ((UVar21 + 1) - uVar17) - uVar19;
                  while( true ) {
                    bVar37 = false;
                    if (_lowestValid_1 < anchor_1 && pBVar27 < _current2_1) {
                      bVar37 = anchor_1[-1] == _current2_1[-1];
                    }
                    if (!bVar37) break;
                    anchor_1 = anchor_1 + -1;
                    _current2_1 = _current2_1 + -1;
                    lStack_d10 = lStack_d10 + 1;
                  }
                  goto LAB_0018c34a;
                }
              }
code_r0x0018c158:
              if (matchLong_1._4_4_ < local_139c) {
                sVar28 = ZSTD_count_2segments(anchor_1 + 4,pBStack_d58 + 4,pBVar25,pBVar12,pBVar24);
                lStack_d10 = sVar28 + 4;
                h2_1._4_4_ = UVar21 - matchLong_1._4_4_;
                while( true ) {
                  bVar37 = false;
                  if (_lowestValid_1 < anchor_1 && pBVar27 < pBStack_d58) {
                    bVar37 = anchor_1[-1] == pBStack_d58[-1];
                  }
                  if (!bVar37) break;
                  anchor_1 = anchor_1 + -1;
                  pBStack_d58 = pBStack_d58 + -1;
                  lStack_d10 = lStack_d10 + 1;
                }
              }
              else {
                sVar28 = ZSTD_count(anchor_1 + 4,pBStack_d58 + 4,pBVar25);
                lStack_d10 = sVar28 + 4;
                h2_1._4_4_ = iVar16 - (int)pBStack_d58;
                while( true ) {
                  bVar37 = false;
                  if (_lowestValid_1 < anchor_1 && pBVar24 < pBStack_d58) {
                    bVar37 = anchor_1[-1] == pBStack_d58[-1];
                  }
                  if (!bVar37) break;
                  anchor_1 = anchor_1 + -1;
                  pBStack_d58 = pBStack_d58 + -1;
                  lStack_d10 = lStack_d10 + 1;
                }
              }
            }
LAB_0018c34a:
            local_ca8 = offsetSaved_1;
            offsetSaved_1 = h2_1._4_4_;
            uVar36 = (long)anchor_1 - (long)_lowestValid_1;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar36) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar25 < _lowestValid_1 + uVar36) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar25 + -0x20 < _lowestValid_1 + uVar36) {
              ZSTD_safecopyLiterals
                        (seqStore->lit,_lowestValid_1,_lowestValid_1 + uVar36,pBVar25 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,_lowestValid_1);
              if (0x10 < uVar36) {
                pBVar13 = seqStore->lit;
                pBVar35 = pBVar13 + 0x10;
                lVar32 = (long)pBVar35 - (long)(_lowestValid_1 + 0x10);
                if (lVar32 < 8 && -0x10 < lVar32) {
                  __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1268,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                if (lVar32 < 0x10 && -0x10 < lVar32) {
                  __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1270,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                ZSTD_copy16(pBVar35,_lowestValid_1 + 0x10);
                while (pBVar13 = pBVar13 + 0x20, pBVar13 < pBVar35 + (uVar36 - 0x10)) {
                  op_7 = _lowestValid_1 + 0x20;
                  ZSTD_copy16(pBVar13,op_7);
                  ZSTD_copy16(pBVar13 + 0x10,_lowestValid_1 + 0x30);
                  _lowestValid_1 = op_7;
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar36;
            if (0xffff < uVar36) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x204d,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->litLength = (U16)uVar36;
            seqStore->sequences->offset = h2_1._4_4_ + 3;
            if (0xffff < lStack_d10 - 3U) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(lStack_d10 - 3U);
            seqStore->sequences = seqStore->sequences + 1;
            goto LAB_0018c91b;
          }
        }
        else {
          pBStack_d58 = pBVar11 + pUVar10[sVar31];
          matchLong_1._4_4_ = pUVar10[sVar31] + uVar19;
          if (pBVar27 < pBStack_d58) {
            UVar22 = MEM_read32(pBStack_d58);
            UVar23 = MEM_read32(anchor_1);
            if (UVar22 == UVar23) goto LAB_0018bda7;
          }
        }
        anchor_1 = anchor_1 + ((long)anchor_1 - (long)_lowestValid_1 >> 8) + 1;
      }
      else {
        UVar22 = MEM_read32(local_13f0);
        UVar23 = MEM_read32(anchor_1 + 1);
        if (UVar22 != UVar23) goto LAB_0018b9cb;
        local_1400 = pBVar25;
        if (uVar18 < local_139c) {
          local_1400 = pBVar12;
        }
        sVar28 = ZSTD_count_2segments(anchor_1 + 5,local_13f0 + 4,pBVar25,local_1400,pBVar24);
        lStack_d10 = sVar28 + 4;
        anchor_1 = anchor_1 + 1;
        uVar36 = (long)anchor_1 - (long)_lowestValid_1;
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar36) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar25 < _lowestValid_1 + uVar36) {
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar25 + -0x20 < _lowestValid_1 + uVar36) {
          ZSTD_safecopyLiterals
                    (seqStore->lit,_lowestValid_1,_lowestValid_1 + uVar36,pBVar25 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,_lowestValid_1);
          if (0x10 < uVar36) {
            pBVar13 = seqStore->lit;
            pBVar35 = pBVar13 + 0x10;
            lVar32 = (long)pBVar35 - (long)(_lowestValid_1 + 0x10);
            if (lVar32 < 8 && -0x10 < lVar32) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if (lVar32 < 0x10 && -0x10 < lVar32) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            ZSTD_copy16(pBVar35,_lowestValid_1 + 0x10);
            while (pBVar13 = pBVar13 + 0x20, pBVar13 < pBVar35 + (uVar36 - 0x10)) {
              op_5 = _lowestValid_1 + 0x20;
              ZSTD_copy16(pBVar13,op_5);
              ZSTD_copy16(pBVar13 + 0x10,_lowestValid_1 + 0x30);
              _lowestValid_1 = op_5;
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar36;
        if (0xffff < uVar36) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar36;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar28 + 1) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar28 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_0018c91b:
        _lowestValid_1 = anchor_1 + lStack_d10;
        anchor_1 = _lowestValid_1;
        if (_lowestValid_1 <= pBVar26) {
          uVar17 = UVar21 + 2;
          sVar28 = ZSTD_hashPtr(pBVar7 + uVar17,UVar1,8);
          pUVar5[sVar28] = uVar17;
          sVar28 = ZSTD_hashPtr(_lowestValid_1 + -2,UVar1,8);
          pUVar5[sVar28] = ((int)_lowestValid_1 + -2) - iVar15;
          sVar28 = ZSTD_hashPtr(pBVar7 + uVar17,UVar2,5);
          pUVar6[sVar28] = uVar17;
          sVar28 = ZSTD_hashPtr(_lowestValid_1 + -1,UVar2,5);
          pUVar6[sVar28] = ((int)_lowestValid_1 + -1) - iVar15;
          for (; uVar17 = local_ca8, _lowestValid_1 = anchor_1, anchor_1 <= pBVar26;
              anchor_1 = anchor_1 + sVar28 + 4) {
            UVar21 = (int)anchor_1 - iVar15;
            uVar18 = UVar21 - local_ca8;
            if (uVar18 < local_139c) {
              local_14a0 = pBVar11 + ((ulong)uVar18 - (ulong)uVar19);
            }
            else {
              local_14a0 = pBVar7 + uVar18;
            }
            if ((local_139c - 1) - uVar18 < 3) break;
            UVar22 = MEM_read32(local_14a0);
            UVar23 = MEM_read32(anchor_1);
            if (UVar22 != UVar23) break;
            local_14b0 = pBVar25;
            if (uVar18 < local_139c) {
              local_14b0 = pBVar12;
            }
            sVar28 = ZSTD_count_2segments(anchor_1 + 4,local_14a0 + 4,pBVar25,local_14b0,pBVar24);
            local_ca8 = offsetSaved_1;
            offsetSaved_1 = uVar17;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar25 < anchor_1) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar25 + -0x20 < anchor_1) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor_1,anchor_1,pBVar25 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor_1);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar28 + 1) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(sVar28 + 1);
            seqStore->sequences = seqStore->sequences + 1;
            sVar29 = ZSTD_hashPtr(anchor_1,UVar2,5);
            pUVar6[sVar29] = UVar21;
            sVar29 = ZSTD_hashPtr(anchor_1,UVar1,8);
            pUVar5[sVar29] = UVar21;
          }
        }
      }
      goto LAB_0018ab09;
    }
    if (offsetSaved_1 == 0) {
      local_1504 = 0;
    }
    else {
      local_1504 = offsetSaved_1;
    }
    *rep = local_1504;
    if (local_ca8 == 0) {
      local_1508 = 0;
    }
    else {
      local_1508 = local_ca8;
    }
    rep[1] = local_1508;
    ms_local = (ZSTD_matchState_t *)(pBVar25 + -(long)_lowestValid_1);
    break;
  case 6:
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar6 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar7 = (ms->window).base;
    iVar15 = (int)pBVar7;
    uVar17 = (iVar14 - iVar15) + iVar16;
    UVar21 = (ms->window).dictLimit;
    uVar18 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    local_150c = UVar21;
    if (uVar18 < uVar17 - UVar21) {
      local_150c = uVar17 - uVar18;
    }
    pBVar24 = pBVar7 + local_150c;
    pBVar25 = (BYTE *)((long)src + srcSize);
    pBVar26 = pBVar25 + -8;
    offsetSaved_2 = *rep;
    local_ea0 = rep[1];
    pZVar8 = ms->dictMatchState;
    pUVar9 = pZVar8->hashTable;
    pUVar10 = pZVar8->chainTable;
    pBVar11 = (pZVar8->window).base;
    pBVar27 = pBVar11 + (pZVar8->window).dictLimit;
    pBVar12 = (pZVar8->window).nextSrc;
    uVar19 = local_150c - ((int)pBVar12 - (int)pBVar11);
    UVar3 = (pZVar8->cParams).hashLog;
    UVar4 = (pZVar8->cParams).chainLog;
    uVar20 = (iVar14 - (int)pBVar24) + ((int)pBVar12 - (int)pBVar27);
    if (UVar21 + uVar18 < uVar17) {
      __assert_fail("lowestValid + maxDistance >= endIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3b45,
                    "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                   );
    }
    anchor_2 = (BYTE *)((long)src + (long)(int)(uint)(uVar20 == 0));
    if (uVar20 < offsetSaved_2) {
      __assert_fail("offset_1 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3b52,
                    "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                   );
    }
    _lowestValid_2 = (BYTE *)src;
    if (uVar20 < local_ea0) {
      __assert_fail("offset_2 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3b53,
                    "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                   );
    }
LAB_0018e04d:
    if (anchor_2 < pBVar26) {
      sVar28 = ZSTD_hashPtr(anchor_2,UVar1,8);
      sVar29 = ZSTD_hashPtr(anchor_2,UVar2,6);
      sVar30 = ZSTD_hashPtr(anchor_2,UVar3,8);
      sVar31 = ZSTD_hashPtr(anchor_2,UVar4,6);
      iVar16 = (int)anchor_2;
      UVar21 = iVar16 - iVar15;
      uVar17 = pUVar5[sVar28];
      matchLong_2._4_4_ = pUVar6[sVar29];
      match_2 = pBVar7 + uVar17;
      pBStack_f50 = pBVar7 + matchLong_2._4_4_;
      uVar18 = (UVar21 + 1) - offsetSaved_2;
      if (uVar18 < local_150c) {
        local_1560 = pBVar11 + (uVar18 - uVar19);
      }
      else {
        local_1560 = pBVar7 + uVar18;
      }
      pUVar6[sVar29] = UVar21;
      pUVar5[sVar28] = UVar21;
      if ((local_150c - 1) - uVar18 < 3) {
LAB_0018ef0f:
        if (local_150c < uVar17) {
          UVar33 = MEM_read64(match_2);
          UVar34 = MEM_read64(anchor_2);
          if (UVar33 != UVar34) goto LAB_0018f1f4;
          sVar28 = ZSTD_count(anchor_2 + 8,match_2 + 8,pBVar25);
          lStack_f08 = sVar28 + 8;
          h2_2._4_4_ = iVar16 - (int)match_2;
          while( true ) {
            bVar37 = false;
            if (_lowestValid_2 < anchor_2 && pBVar24 < match_2) {
              bVar37 = anchor_2[-1] == match_2[-1];
            }
            if (!bVar37) break;
            anchor_2 = anchor_2 + -1;
            match_2 = match_2 + -1;
            lStack_f08 = lStack_f08 + 1;
          }
          goto LAB_0018f88e;
        }
        uVar17 = pUVar9[sVar30];
        pBStack_f78 = pBVar11 + uVar17;
        if (pBVar12 <= pBStack_f78) {
          __assert_fail("dictMatchL < dictEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x3b8a,
                        "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                       );
        }
        if (pBVar27 < pBStack_f78) {
          UVar33 = MEM_read64(pBStack_f78);
          UVar34 = MEM_read64(anchor_2);
          if (UVar33 == UVar34) {
            sVar28 = ZSTD_count_2segments(anchor_2 + 8,pBStack_f78 + 8,pBVar25,pBVar12,pBVar24);
            lStack_f08 = sVar28 + 8;
            h2_2._4_4_ = (UVar21 - uVar17) - uVar19;
            while( true ) {
              bVar37 = false;
              if (_lowestValid_2 < anchor_2 && pBVar27 < pBStack_f78) {
                bVar37 = anchor_2[-1] == pBStack_f78[-1];
              }
              if (!bVar37) break;
              anchor_2 = anchor_2 + -1;
              pBStack_f78 = pBStack_f78 + -1;
              lStack_f08 = lStack_f08 + 1;
            }
            goto LAB_0018f88e;
          }
        }
LAB_0018f1f4:
        if (local_150c < matchLong_2._4_4_) {
          UVar22 = MEM_read32(pBStack_f50);
          UVar23 = MEM_read32(anchor_2);
          if (UVar22 == UVar23) {
LAB_0018f2eb:
            sVar28 = ZSTD_hashPtr(anchor_2 + 1,UVar1,8);
            sVar29 = ZSTD_hashPtr(anchor_2 + 1,UVar3,8);
            uVar17 = pUVar5[sVar28];
            pBStack_fa0 = pBVar7 + uVar17;
            pUVar5[sVar28] = UVar21 + 1;
            if (local_150c < uVar17) {
              UVar33 = MEM_read64(pBStack_fa0);
              UVar34 = MEM_read64(anchor_2 + 1);
              if (UVar33 != UVar34) goto code_r0x0018f69c;
              sVar28 = ZSTD_count(anchor_2 + 9,pBStack_fa0 + 8,pBVar25);
              lStack_f08 = sVar28 + 8;
              anchor_2 = anchor_2 + 1;
              h2_2._4_4_ = (int)anchor_2 - (int)pBStack_fa0;
              while( true ) {
                bVar37 = false;
                if (_lowestValid_2 < anchor_2 && pBVar24 < pBStack_fa0) {
                  bVar37 = anchor_2[-1] == pBStack_fa0[-1];
                }
                if (!bVar37) break;
                anchor_2 = anchor_2 + -1;
                pBStack_fa0 = pBStack_fa0 + -1;
                lStack_f08 = lStack_f08 + 1;
              }
            }
            else {
              uVar17 = pUVar9[sVar29];
              _current2_2 = pBVar11 + uVar17;
              if (pBVar12 <= _current2_2) {
                __assert_fail("dictMatchL3 < dictEnd",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x3bbd,
                              "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                             );
              }
              if (pBVar27 < _current2_2) {
                UVar33 = MEM_read64(_current2_2);
                UVar34 = MEM_read64(anchor_2 + 1);
                if (UVar33 == UVar34) {
                  sVar28 = ZSTD_count_2segments
                                     (anchor_2 + 9,_current2_2 + 8,pBVar25,pBVar12,pBVar24);
                  lStack_f08 = sVar28 + 8;
                  anchor_2 = anchor_2 + 1;
                  h2_2._4_4_ = ((UVar21 + 1) - uVar17) - uVar19;
                  while( true ) {
                    bVar37 = false;
                    if (_lowestValid_2 < anchor_2 && pBVar27 < _current2_2) {
                      bVar37 = anchor_2[-1] == _current2_2[-1];
                    }
                    if (!bVar37) break;
                    anchor_2 = anchor_2 + -1;
                    _current2_2 = _current2_2 + -1;
                    lStack_f08 = lStack_f08 + 1;
                  }
                  goto LAB_0018f88e;
                }
              }
code_r0x0018f69c:
              if (matchLong_2._4_4_ < local_150c) {
                sVar28 = ZSTD_count_2segments(anchor_2 + 4,pBStack_f50 + 4,pBVar25,pBVar12,pBVar24);
                lStack_f08 = sVar28 + 4;
                h2_2._4_4_ = UVar21 - matchLong_2._4_4_;
                while( true ) {
                  bVar37 = false;
                  if (_lowestValid_2 < anchor_2 && pBVar27 < pBStack_f50) {
                    bVar37 = anchor_2[-1] == pBStack_f50[-1];
                  }
                  if (!bVar37) break;
                  anchor_2 = anchor_2 + -1;
                  pBStack_f50 = pBStack_f50 + -1;
                  lStack_f08 = lStack_f08 + 1;
                }
              }
              else {
                sVar28 = ZSTD_count(anchor_2 + 4,pBStack_f50 + 4,pBVar25);
                lStack_f08 = sVar28 + 4;
                h2_2._4_4_ = iVar16 - (int)pBStack_f50;
                while( true ) {
                  bVar37 = false;
                  if (_lowestValid_2 < anchor_2 && pBVar24 < pBStack_f50) {
                    bVar37 = anchor_2[-1] == pBStack_f50[-1];
                  }
                  if (!bVar37) break;
                  anchor_2 = anchor_2 + -1;
                  pBStack_f50 = pBStack_f50 + -1;
                  lStack_f08 = lStack_f08 + 1;
                }
              }
            }
LAB_0018f88e:
            local_ea0 = offsetSaved_2;
            offsetSaved_2 = h2_2._4_4_;
            uVar36 = (long)anchor_2 - (long)_lowestValid_2;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar36) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar25 < _lowestValid_2 + uVar36) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar25 + -0x20 < _lowestValid_2 + uVar36) {
              ZSTD_safecopyLiterals
                        (seqStore->lit,_lowestValid_2,_lowestValid_2 + uVar36,pBVar25 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,_lowestValid_2);
              if (0x10 < uVar36) {
                pBVar13 = seqStore->lit;
                pBVar35 = pBVar13 + 0x10;
                lVar32 = (long)pBVar35 - (long)(_lowestValid_2 + 0x10);
                if (lVar32 < 8 && -0x10 < lVar32) {
                  __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1268,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                if (lVar32 < 0x10 && -0x10 < lVar32) {
                  __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1270,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                ZSTD_copy16(pBVar35,_lowestValid_2 + 0x10);
                while (pBVar13 = pBVar13 + 0x20, pBVar13 < pBVar35 + (uVar36 - 0x10)) {
                  op_12 = _lowestValid_2 + 0x20;
                  ZSTD_copy16(pBVar13,op_12);
                  ZSTD_copy16(pBVar13 + 0x10,_lowestValid_2 + 0x30);
                  _lowestValid_2 = op_12;
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar36;
            if (0xffff < uVar36) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x204d,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->litLength = (U16)uVar36;
            seqStore->sequences->offset = h2_2._4_4_ + 3;
            if (0xffff < lStack_f08 - 3U) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(lStack_f08 - 3U);
            seqStore->sequences = seqStore->sequences + 1;
            goto LAB_0018fe5f;
          }
        }
        else {
          pBStack_f50 = pBVar11 + pUVar10[sVar31];
          matchLong_2._4_4_ = pUVar10[sVar31] + uVar19;
          if (pBVar27 < pBStack_f50) {
            UVar22 = MEM_read32(pBStack_f50);
            UVar23 = MEM_read32(anchor_2);
            if (UVar22 == UVar23) goto LAB_0018f2eb;
          }
        }
        anchor_2 = anchor_2 + ((long)anchor_2 - (long)_lowestValid_2 >> 8) + 1;
      }
      else {
        UVar22 = MEM_read32(local_1560);
        UVar23 = MEM_read32(anchor_2 + 1);
        if (UVar22 != UVar23) goto LAB_0018ef0f;
        local_1570 = pBVar25;
        if (uVar18 < local_150c) {
          local_1570 = pBVar12;
        }
        sVar28 = ZSTD_count_2segments(anchor_2 + 5,local_1560 + 4,pBVar25,local_1570,pBVar24);
        lStack_f08 = sVar28 + 4;
        anchor_2 = anchor_2 + 1;
        uVar36 = (long)anchor_2 - (long)_lowestValid_2;
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar36) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar25 < _lowestValid_2 + uVar36) {
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar25 + -0x20 < _lowestValid_2 + uVar36) {
          ZSTD_safecopyLiterals
                    (seqStore->lit,_lowestValid_2,_lowestValid_2 + uVar36,pBVar25 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,_lowestValid_2);
          if (0x10 < uVar36) {
            pBVar13 = seqStore->lit;
            pBVar35 = pBVar13 + 0x10;
            lVar32 = (long)pBVar35 - (long)(_lowestValid_2 + 0x10);
            if (lVar32 < 8 && -0x10 < lVar32) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if (lVar32 < 0x10 && -0x10 < lVar32) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            ZSTD_copy16(pBVar35,_lowestValid_2 + 0x10);
            while (pBVar13 = pBVar13 + 0x20, pBVar13 < pBVar35 + (uVar36 - 0x10)) {
              op_10 = _lowestValid_2 + 0x20;
              ZSTD_copy16(pBVar13,op_10);
              ZSTD_copy16(pBVar13 + 0x10,_lowestValid_2 + 0x30);
              _lowestValid_2 = op_10;
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar36;
        if (0xffff < uVar36) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar36;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar28 + 1) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar28 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_0018fe5f:
        _lowestValid_2 = anchor_2 + lStack_f08;
        anchor_2 = _lowestValid_2;
        if (_lowestValid_2 <= pBVar26) {
          uVar17 = UVar21 + 2;
          sVar28 = ZSTD_hashPtr(pBVar7 + uVar17,UVar1,8);
          pUVar5[sVar28] = uVar17;
          sVar28 = ZSTD_hashPtr(_lowestValid_2 + -2,UVar1,8);
          pUVar5[sVar28] = ((int)_lowestValid_2 + -2) - iVar15;
          sVar28 = ZSTD_hashPtr(pBVar7 + uVar17,UVar2,6);
          pUVar6[sVar28] = uVar17;
          sVar28 = ZSTD_hashPtr(_lowestValid_2 + -1,UVar2,6);
          pUVar6[sVar28] = ((int)_lowestValid_2 + -1) - iVar15;
          for (; uVar17 = local_ea0, _lowestValid_2 = anchor_2, anchor_2 <= pBVar26;
              anchor_2 = anchor_2 + sVar28 + 4) {
            UVar21 = (int)anchor_2 - iVar15;
            uVar18 = UVar21 - local_ea0;
            if (uVar18 < local_150c) {
              local_1610 = pBVar11 + ((ulong)uVar18 - (ulong)uVar19);
            }
            else {
              local_1610 = pBVar7 + uVar18;
            }
            if ((local_150c - 1) - uVar18 < 3) break;
            UVar22 = MEM_read32(local_1610);
            UVar23 = MEM_read32(anchor_2);
            if (UVar22 != UVar23) break;
            local_1620 = pBVar25;
            if (uVar18 < local_150c) {
              local_1620 = pBVar12;
            }
            sVar28 = ZSTD_count_2segments(anchor_2 + 4,local_1610 + 4,pBVar25,local_1620,pBVar24);
            local_ea0 = offsetSaved_2;
            offsetSaved_2 = uVar17;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar25 < anchor_2) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar25 + -0x20 < anchor_2) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor_2,anchor_2,pBVar25 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor_2);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar28 + 1) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(sVar28 + 1);
            seqStore->sequences = seqStore->sequences + 1;
            sVar29 = ZSTD_hashPtr(anchor_2,UVar2,6);
            pUVar6[sVar29] = UVar21;
            sVar29 = ZSTD_hashPtr(anchor_2,UVar1,8);
            pUVar5[sVar29] = UVar21;
          }
        }
      }
      goto LAB_0018e04d;
    }
    if (offsetSaved_2 == 0) {
      local_1674 = 0;
    }
    else {
      local_1674 = offsetSaved_2;
    }
    *rep = local_1674;
    if (local_ea0 == 0) {
      local_1678 = 0;
    }
    else {
      local_1678 = local_ea0;
    }
    rep[1] = local_1678;
    ms_local = (ZSTD_matchState_t *)(pBVar25 + -(long)_lowestValid_2);
    break;
  case 7:
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar6 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar7 = (ms->window).base;
    iVar15 = (int)pBVar7;
    uVar17 = (iVar14 - iVar15) + iVar16;
    UVar21 = (ms->window).dictLimit;
    uVar18 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    local_167c = UVar21;
    if (uVar18 < uVar17 - UVar21) {
      local_167c = uVar17 - uVar18;
    }
    pBVar24 = pBVar7 + local_167c;
    pBVar25 = (BYTE *)((long)src + srcSize);
    pBVar26 = pBVar25 + -8;
    offsetSaved_3 = *rep;
    local_1098 = rep[1];
    pZVar8 = ms->dictMatchState;
    pUVar9 = pZVar8->hashTable;
    pUVar10 = pZVar8->chainTable;
    pBVar11 = (pZVar8->window).base;
    pBVar27 = pBVar11 + (pZVar8->window).dictLimit;
    pBVar12 = (pZVar8->window).nextSrc;
    uVar19 = local_167c - ((int)pBVar12 - (int)pBVar11);
    UVar3 = (pZVar8->cParams).hashLog;
    UVar4 = (pZVar8->cParams).chainLog;
    uVar20 = (iVar14 - (int)pBVar24) + ((int)pBVar12 - (int)pBVar27);
    if (UVar21 + uVar18 < uVar17) {
      __assert_fail("lowestValid + maxDistance >= endIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3b45,
                    "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                   );
    }
    anchor_3 = (BYTE *)((long)src + (long)(int)(uint)(uVar20 == 0));
    if (uVar20 < offsetSaved_3) {
      __assert_fail("offset_1 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3b52,
                    "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                   );
    }
    _lowestValid_3 = (BYTE *)src;
    if (uVar20 < local_1098) {
      __assert_fail("offset_2 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3b53,
                    "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                   );
    }
LAB_00191591:
    if (anchor_3 < pBVar26) {
      sVar28 = ZSTD_hashPtr(anchor_3,UVar1,8);
      sVar29 = ZSTD_hashPtr(anchor_3,UVar2,7);
      sVar30 = ZSTD_hashPtr(anchor_3,UVar3,8);
      sVar31 = ZSTD_hashPtr(anchor_3,UVar4,7);
      iVar16 = (int)anchor_3;
      UVar21 = iVar16 - iVar15;
      uVar17 = pUVar5[sVar28];
      matchLong_3._4_4_ = pUVar6[sVar29];
      match_3 = pBVar7 + uVar17;
      pBStack_1148 = pBVar7 + matchLong_3._4_4_;
      uVar18 = (UVar21 + 1) - offsetSaved_3;
      if (uVar18 < local_167c) {
        local_16d0 = pBVar11 + (uVar18 - uVar19);
      }
      else {
        local_16d0 = pBVar7 + uVar18;
      }
      pUVar6[sVar29] = UVar21;
      pUVar5[sVar28] = UVar21;
      if ((local_167c - 1) - uVar18 < 3) {
LAB_00192453:
        if (local_167c < uVar17) {
          UVar33 = MEM_read64(match_3);
          UVar34 = MEM_read64(anchor_3);
          if (UVar33 != UVar34) goto LAB_00192738;
          sVar28 = ZSTD_count(anchor_3 + 8,match_3 + 8,pBVar25);
          lStack_1100 = sVar28 + 8;
          h2_3._4_4_ = iVar16 - (int)match_3;
          while( true ) {
            bVar37 = false;
            if (_lowestValid_3 < anchor_3 && pBVar24 < match_3) {
              bVar37 = anchor_3[-1] == match_3[-1];
            }
            if (!bVar37) break;
            anchor_3 = anchor_3 + -1;
            match_3 = match_3 + -1;
            lStack_1100 = lStack_1100 + 1;
          }
          goto LAB_00192dd2;
        }
        uVar17 = pUVar9[sVar30];
        pBStack_1170 = pBVar11 + uVar17;
        if (pBVar12 <= pBStack_1170) {
          __assert_fail("dictMatchL < dictEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x3b8a,
                        "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                       );
        }
        if (pBVar27 < pBStack_1170) {
          UVar33 = MEM_read64(pBStack_1170);
          UVar34 = MEM_read64(anchor_3);
          if (UVar33 == UVar34) {
            sVar28 = ZSTD_count_2segments(anchor_3 + 8,pBStack_1170 + 8,pBVar25,pBVar12,pBVar24);
            lStack_1100 = sVar28 + 8;
            h2_3._4_4_ = (UVar21 - uVar17) - uVar19;
            while( true ) {
              bVar37 = false;
              if (_lowestValid_3 < anchor_3 && pBVar27 < pBStack_1170) {
                bVar37 = anchor_3[-1] == pBStack_1170[-1];
              }
              if (!bVar37) break;
              anchor_3 = anchor_3 + -1;
              pBStack_1170 = pBStack_1170 + -1;
              lStack_1100 = lStack_1100 + 1;
            }
            goto LAB_00192dd2;
          }
        }
LAB_00192738:
        if (local_167c < matchLong_3._4_4_) {
          UVar22 = MEM_read32(pBStack_1148);
          UVar23 = MEM_read32(anchor_3);
          if (UVar22 == UVar23) {
LAB_0019282f:
            sVar28 = ZSTD_hashPtr(anchor_3 + 1,UVar1,8);
            sVar29 = ZSTD_hashPtr(anchor_3 + 1,UVar3,8);
            uVar17 = pUVar5[sVar28];
            pBStack_1198 = pBVar7 + uVar17;
            pUVar5[sVar28] = UVar21 + 1;
            if (local_167c < uVar17) {
              UVar33 = MEM_read64(pBStack_1198);
              UVar34 = MEM_read64(anchor_3 + 1);
              if (UVar33 != UVar34) goto code_r0x00192be0;
              sVar28 = ZSTD_count(anchor_3 + 9,pBStack_1198 + 8,pBVar25);
              lStack_1100 = sVar28 + 8;
              anchor_3 = anchor_3 + 1;
              h2_3._4_4_ = (int)anchor_3 - (int)pBStack_1198;
              while( true ) {
                bVar37 = false;
                if (_lowestValid_3 < anchor_3 && pBVar24 < pBStack_1198) {
                  bVar37 = anchor_3[-1] == pBStack_1198[-1];
                }
                if (!bVar37) break;
                anchor_3 = anchor_3 + -1;
                pBStack_1198 = pBStack_1198 + -1;
                lStack_1100 = lStack_1100 + 1;
              }
            }
            else {
              uVar17 = pUVar9[sVar29];
              _current2_3 = pBVar11 + uVar17;
              if (pBVar12 <= _current2_3) {
                __assert_fail("dictMatchL3 < dictEnd",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x3bbd,
                              "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                             );
              }
              if (pBVar27 < _current2_3) {
                UVar33 = MEM_read64(_current2_3);
                UVar34 = MEM_read64(anchor_3 + 1);
                if (UVar33 == UVar34) {
                  sVar28 = ZSTD_count_2segments
                                     (anchor_3 + 9,_current2_3 + 8,pBVar25,pBVar12,pBVar24);
                  lStack_1100 = sVar28 + 8;
                  anchor_3 = anchor_3 + 1;
                  h2_3._4_4_ = ((UVar21 + 1) - uVar17) - uVar19;
                  while( true ) {
                    bVar37 = false;
                    if (_lowestValid_3 < anchor_3 && pBVar27 < _current2_3) {
                      bVar37 = anchor_3[-1] == _current2_3[-1];
                    }
                    if (!bVar37) break;
                    anchor_3 = anchor_3 + -1;
                    _current2_3 = _current2_3 + -1;
                    lStack_1100 = lStack_1100 + 1;
                  }
                  goto LAB_00192dd2;
                }
              }
code_r0x00192be0:
              if (matchLong_3._4_4_ < local_167c) {
                sVar28 = ZSTD_count_2segments(anchor_3 + 4,pBStack_1148 + 4,pBVar25,pBVar12,pBVar24)
                ;
                lStack_1100 = sVar28 + 4;
                h2_3._4_4_ = UVar21 - matchLong_3._4_4_;
                while( true ) {
                  bVar37 = false;
                  if (_lowestValid_3 < anchor_3 && pBVar27 < pBStack_1148) {
                    bVar37 = anchor_3[-1] == pBStack_1148[-1];
                  }
                  if (!bVar37) break;
                  anchor_3 = anchor_3 + -1;
                  pBStack_1148 = pBStack_1148 + -1;
                  lStack_1100 = lStack_1100 + 1;
                }
              }
              else {
                sVar28 = ZSTD_count(anchor_3 + 4,pBStack_1148 + 4,pBVar25);
                lStack_1100 = sVar28 + 4;
                h2_3._4_4_ = iVar16 - (int)pBStack_1148;
                while( true ) {
                  bVar37 = false;
                  if (_lowestValid_3 < anchor_3 && pBVar24 < pBStack_1148) {
                    bVar37 = anchor_3[-1] == pBStack_1148[-1];
                  }
                  if (!bVar37) break;
                  anchor_3 = anchor_3 + -1;
                  pBStack_1148 = pBStack_1148 + -1;
                  lStack_1100 = lStack_1100 + 1;
                }
              }
            }
LAB_00192dd2:
            local_1098 = offsetSaved_3;
            offsetSaved_3 = h2_3._4_4_;
            uVar36 = (long)anchor_3 - (long)_lowestValid_3;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar36) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar25 < _lowestValid_3 + uVar36) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar25 + -0x20 < _lowestValid_3 + uVar36) {
              ZSTD_safecopyLiterals
                        (seqStore->lit,_lowestValid_3,_lowestValid_3 + uVar36,pBVar25 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,_lowestValid_3);
              if (0x10 < uVar36) {
                pBVar13 = seqStore->lit;
                pBVar35 = pBVar13 + 0x10;
                lVar32 = (long)pBVar35 - (long)(_lowestValid_3 + 0x10);
                if (lVar32 < 8 && -0x10 < lVar32) {
                  __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1268,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                if (lVar32 < 0x10 && -0x10 < lVar32) {
                  __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1270,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                ZSTD_copy16(pBVar35,_lowestValid_3 + 0x10);
                while (pBVar13 = pBVar13 + 0x20, pBVar13 < pBVar35 + (uVar36 - 0x10)) {
                  op_17 = _lowestValid_3 + 0x20;
                  ZSTD_copy16(pBVar13,op_17);
                  ZSTD_copy16(pBVar13 + 0x10,_lowestValid_3 + 0x30);
                  _lowestValid_3 = op_17;
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar36;
            if (0xffff < uVar36) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x204d,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->litLength = (U16)uVar36;
            seqStore->sequences->offset = h2_3._4_4_ + 3;
            if (0xffff < lStack_1100 - 3U) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(lStack_1100 - 3U);
            seqStore->sequences = seqStore->sequences + 1;
            goto LAB_001933a3;
          }
        }
        else {
          pBStack_1148 = pBVar11 + pUVar10[sVar31];
          matchLong_3._4_4_ = pUVar10[sVar31] + uVar19;
          if (pBVar27 < pBStack_1148) {
            UVar22 = MEM_read32(pBStack_1148);
            UVar23 = MEM_read32(anchor_3);
            if (UVar22 == UVar23) goto LAB_0019282f;
          }
        }
        anchor_3 = anchor_3 + ((long)anchor_3 - (long)_lowestValid_3 >> 8) + 1;
      }
      else {
        UVar22 = MEM_read32(local_16d0);
        UVar23 = MEM_read32(anchor_3 + 1);
        if (UVar22 != UVar23) goto LAB_00192453;
        local_16e0 = pBVar25;
        if (uVar18 < local_167c) {
          local_16e0 = pBVar12;
        }
        sVar28 = ZSTD_count_2segments(anchor_3 + 5,local_16d0 + 4,pBVar25,local_16e0,pBVar24);
        lStack_1100 = sVar28 + 4;
        anchor_3 = anchor_3 + 1;
        uVar36 = (long)anchor_3 - (long)_lowestValid_3;
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar36) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar25 < _lowestValid_3 + uVar36) {
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar25 + -0x20 < _lowestValid_3 + uVar36) {
          ZSTD_safecopyLiterals
                    (seqStore->lit,_lowestValid_3,_lowestValid_3 + uVar36,pBVar25 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,_lowestValid_3);
          if (0x10 < uVar36) {
            pBVar13 = seqStore->lit;
            pBVar35 = pBVar13 + 0x10;
            lVar32 = (long)pBVar35 - (long)(_lowestValid_3 + 0x10);
            if (lVar32 < 8 && -0x10 < lVar32) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if (lVar32 < 0x10 && -0x10 < lVar32) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            ZSTD_copy16(pBVar35,_lowestValid_3 + 0x10);
            while (pBVar13 = pBVar13 + 0x20, pBVar13 < pBVar35 + (uVar36 - 0x10)) {
              op_15 = _lowestValid_3 + 0x20;
              ZSTD_copy16(pBVar13,op_15);
              ZSTD_copy16(pBVar13 + 0x10,_lowestValid_3 + 0x30);
              _lowestValid_3 = op_15;
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar36;
        if (0xffff < uVar36) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar36;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar28 + 1) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar28 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_001933a3:
        _lowestValid_3 = anchor_3 + lStack_1100;
        anchor_3 = _lowestValid_3;
        if (_lowestValid_3 <= pBVar26) {
          uVar17 = UVar21 + 2;
          sVar28 = ZSTD_hashPtr(pBVar7 + uVar17,UVar1,8);
          pUVar5[sVar28] = uVar17;
          sVar28 = ZSTD_hashPtr(_lowestValid_3 + -2,UVar1,8);
          pUVar5[sVar28] = ((int)_lowestValid_3 + -2) - iVar15;
          sVar28 = ZSTD_hashPtr(pBVar7 + uVar17,UVar2,7);
          pUVar6[sVar28] = uVar17;
          sVar28 = ZSTD_hashPtr(_lowestValid_3 + -1,UVar2,7);
          pUVar6[sVar28] = ((int)_lowestValid_3 + -1) - iVar15;
          for (; uVar17 = local_1098, _lowestValid_3 = anchor_3, anchor_3 <= pBVar26;
              anchor_3 = anchor_3 + sVar28 + 4) {
            UVar21 = (int)anchor_3 - iVar15;
            uVar18 = UVar21 - local_1098;
            if (uVar18 < local_167c) {
              local_1780 = pBVar11 + ((ulong)uVar18 - (ulong)uVar19);
            }
            else {
              local_1780 = pBVar7 + uVar18;
            }
            if ((local_167c - 1) - uVar18 < 3) break;
            UVar22 = MEM_read32(local_1780);
            UVar23 = MEM_read32(anchor_3);
            if (UVar22 != UVar23) break;
            local_1790 = pBVar25;
            if (uVar18 < local_167c) {
              local_1790 = pBVar12;
            }
            sVar28 = ZSTD_count_2segments(anchor_3 + 4,local_1780 + 4,pBVar25,local_1790,pBVar24);
            local_1098 = offsetSaved_3;
            offsetSaved_3 = uVar17;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar25 < anchor_3) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar25 + -0x20 < anchor_3) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor_3,anchor_3,pBVar25 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor_3);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar28 + 1) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(sVar28 + 1);
            seqStore->sequences = seqStore->sequences + 1;
            sVar29 = ZSTD_hashPtr(anchor_3,UVar2,7);
            pUVar6[sVar29] = UVar21;
            sVar29 = ZSTD_hashPtr(anchor_3,UVar1,8);
            pUVar5[sVar29] = UVar21;
          }
        }
      }
      goto LAB_00191591;
    }
    if (offsetSaved_3 == 0) {
      local_17e4 = 0;
    }
    else {
      local_17e4 = offsetSaved_3;
    }
    *rep = local_17e4;
    if (local_1098 == 0) {
      local_17e8 = 0;
    }
    else {
      local_17e8 = local_1098;
    }
    rep[1] = local_17e8;
    ms_local = (ZSTD_matchState_t *)(pBVar25 + -(long)_lowestValid_3);
  }
  return (size_t)ms_local;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_dictMatchState);
    case 5 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_dictMatchState);
    case 6 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_dictMatchState);
    case 7 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_dictMatchState);
    }
}